

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.cpp
# Opt level: O1

void __thiscall
SupercellTest_ThreeD_Test::~SupercellTest_ThreeD_Test(SupercellTest_ThreeD_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SupercellTest, ThreeD) {
  span_t span(3, 3);
  span << 4, 0, 0,
          2, 4, 0,
          0, 0, 4;
  supercell supercell(span);
  offset_t offset(3);

  check(supercell);

  std::size_t source, target;
  source = 0; offset << 1, 0, 0; target = 12;
  EXPECT_EQ(target, supercell.add_offset(source, offset).first);
  source = 0; offset << 0, 1, 0; target = 1;
  EXPECT_EQ(target, supercell.add_offset(source, offset).first);
  source = 0; offset << 0, 0, 1; target = 16;
  EXPECT_EQ(target, supercell.add_offset(source, offset).first);
  source = 0; offset << -1, 0, 0; target = 7;
  EXPECT_EQ(target, supercell.add_offset(source, offset).first);
  source = 0; offset << 0, -1, 0; target = 8;
  EXPECT_EQ(target, supercell.add_offset(source, offset).first);
  source = 0; offset << 0, 0, -1; target = 48;
  EXPECT_EQ(target, supercell.add_offset(source, offset).first);
  source = 14; offset << 1, 0, 0; target = 4;
  EXPECT_EQ(target, supercell.add_offset(source, offset).first);
  source = 14; offset << 0, 1, 0; target = 15;
  EXPECT_EQ(target, supercell.add_offset(source, offset).first);
  source = 14; offset << 0, 0, 1; target = 30;
  EXPECT_EQ(target, supercell.add_offset(source, offset).first);
  source = 14; offset << -1, 0, 0; target = 13;
  EXPECT_EQ(target, supercell.add_offset(source, offset).first);
  source = 14; offset << 0, -1, 0; target = 11;
  EXPECT_EQ(target, supercell.add_offset(source, offset).first);
  source = 14; offset << 0, 0, -1; target = 62;
  EXPECT_EQ(target, supercell.add_offset(source, offset).first);
}